

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlDocGetRootElement(xmlDoc *doc)

{
  xmlNodePtr pxVar1;
  
  if (doc != (xmlDoc *)0x0) {
    for (pxVar1 = doc->children; pxVar1 != (xmlNodePtr)0x0; pxVar1 = pxVar1->next) {
      if (pxVar1->type == XML_ELEMENT_NODE) {
        return pxVar1;
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlDocGetRootElement(const xmlDoc *doc) {
    xmlNodePtr ret;

    if (doc == NULL) return(NULL);
    ret = doc->children;
    while (ret != NULL) {
	if (ret->type == XML_ELEMENT_NODE)
	    return(ret);
        ret = ret->next;
    }
    return(ret);
}